

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::PageEncodingStats::write(PageEncodingStats *this,int __fd,void *__buf,size_t __n)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint uVar13;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  undefined4 in_stack_ffffffffffffff98;
  int32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker
            ((TOutputRecursionTracker *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (TProtocol *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),T_STOP,
                     0x70);
  uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c);
  uVar4 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x70c5c3);
  uVar5 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),T_STOP,
                     0x70);
  uVar6 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c);
  uVar7 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x70c636);
  uVar8 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),T_STOP,
                     0x70);
  uVar9 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c);
  uVar10 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x70c6a9);
  uVar11 = duckdb_apache::thrift::protocol::TProtocol::writeFieldStop((TProtocol *)0x70c6c7);
  uVar12 = duckdb_apache::thrift::protocol::TProtocol::writeStructEnd((TProtocol *)0x70c6e5);
  uVar13 = uVar12 + uVar1 + uVar2 + uVar3 + uVar4 + uVar5 + uVar6 + uVar7 + uVar8 + uVar9 + uVar10 +
                    uVar11;
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker
            ((TOutputRecursionTracker *)0x70c708);
  return (ulong)uVar13;
}

Assistant:

uint32_t PageEncodingStats::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("PageEncodingStats");

  xfer += oprot->writeFieldBegin("page_type", ::apache::thrift::protocol::T_I32, 1);
  xfer += oprot->writeI32(static_cast<int32_t>(this->page_type));
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("encoding", ::apache::thrift::protocol::T_I32, 2);
  xfer += oprot->writeI32(static_cast<int32_t>(this->encoding));
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("count", ::apache::thrift::protocol::T_I32, 3);
  xfer += oprot->writeI32(this->count);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}